

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredDecPOMDPDiscrete.cpp
# Opt level: O0

void __thiscall
FactoredDecPOMDPDiscrete::ClipRewardModel(FactoredDecPOMDPDiscrete *this,Index sf,bool sparse)

{
  RewardModelMapping *pRVar1;
  char *__s;
  void *pvVar2;
  ulong uVar3;
  byte in_DL;
  uint in_ESI;
  long *in_RDI;
  long *plVar4;
  double dVar5;
  double dVar6;
  double r;
  Index jaI;
  Index sI;
  size_t nrX;
  size_t i;
  size_t nrS;
  string *in_stack_fffffffffffffed0;
  string *s_str;
  string *in_stack_fffffffffffffee0;
  allocator<char> *__a;
  string *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  RewardModelMappingSparse *this_00;
  size_t in_stack_fffffffffffffef8;
  RewardModelMapping *this_01;
  uint local_dc;
  uint local_d8;
  allocator<char> local_d1;
  string local_d0 [39];
  allocator<char> local_a9;
  string local_a8 [38];
  undefined1 local_82;
  undefined1 local_81 [40];
  allocator<char> local_59;
  string local_58 [48];
  long local_28;
  RewardModelMapping *local_20;
  RewardModelMappingSparse *local_18;
  byte local_d;
  uint local_c;
  
  local_d = in_DL & 1;
  local_c = in_ESI;
  if ((*(byte *)(in_RDI + 0xe0) & 1) != 0) {
    if ((long *)in_RDI[0xdf] != (long *)0x0) {
      (**(code **)(*(long *)in_RDI[0xdf] + 0x18))();
    }
    *(undefined1 *)(in_RDI + 0xe0) = 0;
  }
  *(byte *)((long)in_RDI + 0x701) = local_d & 1;
  local_18 = (RewardModelMappingSparse *)0x1;
  local_20 = (RewardModelMapping *)0x0;
  while (this_01 = local_20, pRVar1 = (RewardModelMapping *)(**(code **)(*in_RDI + 0xa8))(),
        this_01 < pRVar1) {
    if (local_20 != (RewardModelMapping *)(ulong)local_c) {
      local_28 = (**(code **)(*in_RDI + 0xc0))(in_RDI,(ulong)local_20 & 0xffffffff);
      local_18 = (RewardModelMappingSparse *)(local_28 * (long)local_18);
    }
    local_20 = (RewardModelMapping *)
               ((long)&(local_20->super_RewardModel).super_RewardModelDiscreteInterface.
                       super_QTableInterface._vptr_QTableInterface + 1);
  }
  if ((local_d & 1) == 0) {
    pvVar2 = operator_new(0x80);
    (**(code **)(*in_RDI + 0x110))();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8,
               (allocator<char> *)in_stack_fffffffffffffee0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8,
               (allocator<char> *)in_stack_fffffffffffffee0);
    RewardModelMapping::RewardModelMapping
              (this_01,in_stack_fffffffffffffef8,(size_t)in_stack_fffffffffffffef0,
               in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    in_RDI[0xdf] = (long)pvVar2;
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator(&local_d1);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator(&local_a9);
  }
  else {
    __s = (char *)operator_new(200);
    local_82 = 1;
    this_00 = local_18;
    (**(code **)(*in_RDI + 0x110))();
    __a = &local_59;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__s,__a)
    ;
    s_str = (string *)local_81;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__s,__a)
    ;
    RewardModelMappingSparse::RewardModelMappingSparse
              (this_00,(size_t)__s,(size_t)__a,s_str,in_stack_fffffffffffffed0);
    local_82 = 0;
    in_RDI[0xdf] = (long)__s;
    std::__cxx11::string::~string((string *)(local_81 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_81);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator(&local_59);
  }
  for (local_d8 = 0; (RewardModelMappingSparse *)(ulong)local_d8 < local_18; local_d8 = local_d8 + 1
      ) {
    for (local_dc = 0; uVar3 = (**(code **)(*in_RDI + 0x110))(), local_dc < uVar3;
        local_dc = local_dc + 1) {
      plVar4 = in_RDI;
      dVar5 = (double)(**(code **)(*in_RDI + 0x2d0))(in_RDI,local_d8,local_dc);
      dVar6 = dVar5;
      std::abs((int)plVar4);
      if (1e-12 <= dVar6) {
        (**(code **)(*(long *)in_RDI[0xdf] + 8))(dVar5,(long *)in_RDI[0xdf],local_d8,local_dc);
      }
    }
  }
  *(undefined1 *)(in_RDI + 0xe0) = 1;
  return;
}

Assistant:

void FactoredDecPOMDPDiscrete::ClipRewardModel(Index sf, bool sparse)
{
    if(_m_cached_FlatRM){
        delete(_m_p_rModel);
        _m_cached_FlatRM = false;
    }

    _m_sparse_FlatRM = sparse;

    size_t nrS = 1;
    for(size_t i = 0; i < GetNrStateFactors(); i++){
      if(i == sf)
        continue;
      size_t nrX = GetNrValuesForFactor(i);
      nrS *= nrX;
    }

    if(sparse)
        _m_p_rModel=new RewardModelMappingSparse(nrS,
                                                 GetNrJointActions());
    else
        _m_p_rModel=new RewardModelMapping(nrS,
                                           GetNrJointActions());

    for(Index sI=0; sI<nrS; sI++)
        for(Index jaI=0; jaI<GetNrJointActions(); jaI++)
        {
            double r = GetReward(sI, jaI);
        
            if( abs(r) >= REWARD_PRECISION )                
                _m_p_rModel->Set(sI, jaI, r);
        }

    _m_cached_FlatRM = true;
}